

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV2CameraSettingsBlock(Parser *this,Camera *camera)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  ai_real *fOut;
  int local_44;
  
  pbVar6 = (byte *)this->filePtr;
  local_44 = 0;
  do {
    bVar1 = *pbVar6;
    if (bVar1 == 0x2a) {
      do {
        pbVar4 = pbVar6 + 1;
        this->filePtr = (char *)pbVar4;
        iVar3 = strncmp("CAMERA_NEAR",(char *)pbVar4,0xb);
        if (iVar3 == 0) {
          bVar1 = pbVar6[0xc];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
          goto LAB_00394465;
          pbVar4 = pbVar6 + 0xc;
          lVar5 = 0xd;
          fOut = &camera->mNear;
        }
        else {
LAB_00394465:
          iVar3 = strncmp("CAMERA_FAR",(char *)pbVar4,10);
          if (iVar3 == 0) {
            bVar1 = pbVar6[0xb];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar4 = pbVar6 + 0xb;
              lVar5 = 0xc;
              fOut = &camera->mFar;
              goto LAB_003944f5;
            }
          }
          iVar3 = strncmp("CAMERA_FOV",(char *)pbVar4,10);
          if (iVar3 != 0) break;
          bVar1 = pbVar6[0xb];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
          pbVar4 = pbVar6 + 0xb;
          lVar5 = 0xc;
          fOut = (ai_real *)&(camera->super_BaseNode).field_0x154;
        }
LAB_003944f5:
        pbVar6 = pbVar6 + lVar5;
        if (bVar1 == 0) {
          pbVar6 = pbVar4;
        }
        this->filePtr = (char *)pbVar6;
        ParseLV4MeshFloat(this,fOut);
        pbVar6 = (byte *)this->filePtr;
        pbVar4 = pbVar6;
      } while (*pbVar6 == 0x2a);
      pbVar6 = pbVar4;
      bVar1 = *pbVar6;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_00394566;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a CAMERA_SETTINGS chunk (Level 2)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_00394568;
        local_44 = local_44 + 1;
      }
LAB_00394566:
      bVar2 = false;
    }
LAB_00394568:
    this->bLastWasEndLine = bVar2;
    pbVar6 = pbVar6 + 1;
    this->filePtr = (char *)pbVar6;
  } while( true );
}

Assistant:

void Parser::ParseLV2CameraSettingsBlock(ASE::Camera& camera)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"CAMERA_NEAR" ,11))
            {
                ParseLV4MeshFloat(camera.mNear);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FAR" ,10))
            {
                ParseLV4MeshFloat(camera.mFar);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FOV" ,10))
            {
                ParseLV4MeshFloat(camera.mFOV);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","CAMERA_SETTINGS");
    }
    return;
}